

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgumentsChecker.cpp
# Opt level: O0

bool __thiscall DatUnpacker::ArgumentsChecker::check(ArgumentsChecker *this,Arguments *arguments)

{
  bool bVar1;
  Arguments *arguments_local;
  ArgumentsChecker *this_local;
  
  bVar1 = checkFormat(this,&arguments->format);
  if (bVar1) {
    bVar1 = checkSource(this,&arguments->source);
    if (bVar1) {
      bVar1 = checkDestination(this,&arguments->destination);
      if (bVar1) {
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ArgumentsChecker::check(const Arguments& arguments) {
        if (!checkFormat(arguments.format)) {
            return false;
        }

        if (!checkSource(arguments.source)) {
            return false;
        }

        if (!checkDestination(arguments.destination)) {
            return false;
        }

        return true;
    }